

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O2

void ot::commissioner::CborValue::Move(CborValue *dst,CborValue *src)

{
  cn_cbor *pcVar1;
  undefined7 uVar2;
  
  Free(dst);
  uVar2 = *(undefined7 *)&src->field_0x9;
  pcVar1 = src->mCbor;
  dst->mIsRoot = src->mIsRoot;
  *(undefined7 *)&dst->field_0x9 = uVar2;
  dst->mCbor = pcVar1;
  src->mIsRoot = true;
  src->mCbor = (cn_cbor *)0x0;
  return;
}

Assistant:

void CborValue::Move(CborValue &dst, CborValue &src)
{
    dst.Free();
    dst = src;

    src.mIsRoot = true;
    src.mCbor   = nullptr;
}